

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLboolean GVar1;
  int iVar2;
  GLFWwindow *handle;
  _GLFWwindow *previous;
  _GLFWwindow *window;
  _GLFWwndconfig wndconfig;
  _GLFWfbconfig fbconfig;
  GLFWwindow *share_local;
  GLFWmonitor *monitor_local;
  char *title_local;
  int height_local;
  int width_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    _height_local = (_GLFWwindow *)0x0;
  }
  else if ((width < 1) || (height < 1)) {
    _glfwInputError(0x10004,"Invalid window size");
    _height_local = (_GLFWwindow *)0x0;
  }
  else {
    wndconfig.share._0_4_ = Max(_glfw.hints.redBits,0);
    wndconfig.share._4_4_ = Max(_glfw.hints.greenBits,0);
    Max(_glfw.hints.blueBits,0);
    Max(_glfw.hints.alphaBits,0);
    Max(_glfw.hints.depthBits,0);
    Max(_glfw.hints.stencilBits,0);
    Max(_glfw.hints.accumRedBits,0);
    Max(_glfw.hints.accumGreenBits,0);
    Max(_glfw.hints.accumBlueBits,0);
    Max(_glfw.hints.accumAlphaBits,0);
    Max(_glfw.hints.auxBuffers,0);
    Max(_glfw.hints.samples,0);
    wndconfig.title._0_1_ = _glfw.hints.resizable != '\0';
    wndconfig.title._1_1_ = _glfw.hints.visible != '\0';
    wndconfig.title._2_1_ = _glfw.hints.decorated != '\0';
    wndconfig.title._4_4_ = _glfw.hints.clientAPI;
    wndconfig.resizable = (undefined1)_glfw.hints.glMajor;
    wndconfig.visible = _glfw.hints.glMajor._1_1_;
    wndconfig.decorated = _glfw.hints.glMajor._2_1_;
    wndconfig._19_1_ = _glfw.hints.glMajor._3_1_;
    wndconfig.clientAPI = _glfw.hints.glMinor;
    wndconfig.glMajor._0_1_ = _glfw.hints.glForward != '\0';
    wndconfig.glMajor._1_1_ = _glfw.hints.glDebug != '\0';
    wndconfig.glMinor = _glfw.hints.glProfile;
    wndconfig.glForward = (undefined1)_glfw.hints.glRobustness;
    wndconfig.glDebug = _glfw.hints.glRobustness._1_1_;
    wndconfig._34_2_ = _glfw.hints.glRobustness._2_2_;
    window._0_4_ = width;
    window._4_4_ = height;
    wndconfig._0_8_ = title;
    wndconfig._40_8_ = monitor;
    wndconfig.monitor = (_GLFWmonitor *)share;
    GVar1 = _glfwIsValidContextConfig((_GLFWwndconfig *)&window);
    if (GVar1 == '\0') {
      _height_local = (_GLFWwindow *)0x0;
    }
    else {
      _height_local = (_GLFWwindow *)calloc(1,0x298);
      _height_local->next = _glfw.windowListHead;
      _glfw.windowListHead = _height_local;
      if (wndconfig._40_8_ != 0) {
        wndconfig.title._0_1_ = '\x01';
        wndconfig.title._1_1_ = '\x01';
        (_height_local->videoMode).width = width;
        (_height_local->videoMode).height = height;
        iVar2 = Max(_glfw.hints.redBits,0);
        (_height_local->videoMode).redBits = iVar2;
        iVar2 = Max(_glfw.hints.greenBits,0);
        (_height_local->videoMode).greenBits = iVar2;
        iVar2 = Max(_glfw.hints.blueBits,0);
        (_height_local->videoMode).blueBits = iVar2;
        iVar2 = Max(_glfw.hints.refreshRate,0);
        (_height_local->videoMode).refreshRate = iVar2;
      }
      _height_local->monitor = (_GLFWmonitor *)wndconfig._40_8_;
      _height_local->resizable = (GLboolean)wndconfig.title;
      _height_local->decorated = wndconfig.title._2_1_;
      _height_local->cursorMode = 0x34001;
      handle = glfwGetCurrentContext();
      iVar2 = _glfwPlatformCreateWindow
                        (_height_local,(_GLFWwndconfig *)&window,(_GLFWfbconfig *)&wndconfig.share);
      if (iVar2 == 0) {
        glfwDestroyWindow((GLFWwindow *)_height_local);
        glfwMakeContextCurrent(handle);
        _height_local = (_GLFWwindow *)0x0;
      }
      else {
        glfwMakeContextCurrent((GLFWwindow *)_height_local);
        GVar1 = _glfwRefreshContextAttribs();
        if (GVar1 == '\0') {
          glfwDestroyWindow((GLFWwindow *)_height_local);
          glfwMakeContextCurrent(handle);
          _height_local = (_GLFWwindow *)0x0;
        }
        else {
          GVar1 = _glfwIsValidContext((_GLFWwndconfig *)&window);
          if (GVar1 == '\0') {
            glfwDestroyWindow((GLFWwindow *)_height_local);
            glfwMakeContextCurrent(handle);
            _height_local = (_GLFWwindow *)0x0;
          }
          else {
            glClear(0x4000);
            _glfwPlatformSwapBuffers(_height_local);
            glfwMakeContextCurrent(handle);
            if ((wndconfig._40_8_ == 0) && (wndconfig.title._1_1_ != '\0')) {
              glfwShowWindow((GLFWwindow *)_height_local);
            }
          }
        }
      }
    }
  }
  return (GLFWwindow *)_height_local;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window size");
        return NULL;
    }

    // Set up desired framebuffer config
    fbconfig.redBits        = Max(_glfw.hints.redBits, 0);
    fbconfig.greenBits      = Max(_glfw.hints.greenBits, 0);
    fbconfig.blueBits       = Max(_glfw.hints.blueBits, 0);
    fbconfig.alphaBits      = Max(_glfw.hints.alphaBits, 0);
    fbconfig.depthBits      = Max(_glfw.hints.depthBits, 0);
    fbconfig.stencilBits    = Max(_glfw.hints.stencilBits, 0);
    fbconfig.accumRedBits   = Max(_glfw.hints.accumRedBits, 0);
    fbconfig.accumGreenBits = Max(_glfw.hints.accumGreenBits, 0);
    fbconfig.accumBlueBits  = Max(_glfw.hints.accumBlueBits, 0);
    fbconfig.accumAlphaBits = Max(_glfw.hints.accumAlphaBits, 0);
    fbconfig.auxBuffers     = Max(_glfw.hints.auxBuffers, 0);
    fbconfig.stereo         = _glfw.hints.stereo ? GL_TRUE : GL_FALSE;
    fbconfig.samples        = Max(_glfw.hints.samples, 0);
    fbconfig.sRGB           = _glfw.hints.sRGB ? GL_TRUE : GL_FALSE;

    // Set up desired window config
    wndconfig.width         = width;
    wndconfig.height        = height;
    wndconfig.title         = title;
    wndconfig.resizable     = _glfw.hints.resizable ? GL_TRUE : GL_FALSE;
    wndconfig.visible       = _glfw.hints.visible ? GL_TRUE : GL_FALSE;
    wndconfig.decorated     = _glfw.hints.decorated ? GL_TRUE : GL_FALSE;
    wndconfig.clientAPI     = _glfw.hints.clientAPI;
    wndconfig.glMajor       = _glfw.hints.glMajor;
    wndconfig.glMinor       = _glfw.hints.glMinor;
    wndconfig.glForward     = _glfw.hints.glForward ? GL_TRUE : GL_FALSE;
    wndconfig.glDebug       = _glfw.hints.glDebug ? GL_TRUE : GL_FALSE;
    wndconfig.glProfile     = _glfw.hints.glProfile;
    wndconfig.glRobustness  = _glfw.hints.glRobustness;
    wndconfig.monitor       = (_GLFWmonitor*) monitor;
    wndconfig.share         = (_GLFWwindow*) share;

    // Check the OpenGL bits of the window config
    if (!_glfwIsValidContextConfig(&wndconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    if (wndconfig.monitor)
    {
        wndconfig.resizable = GL_TRUE;
        wndconfig.visible   = GL_TRUE;

        // Set up desired video mode
        window->videoMode.width       = width;
        window->videoMode.height      = height;
        window->videoMode.redBits     = Max(_glfw.hints.redBits, 0);
        window->videoMode.greenBits   = Max(_glfw.hints.greenBits, 0);
        window->videoMode.blueBits    = Max(_glfw.hints.blueBits, 0);
        window->videoMode.refreshRate = Max(_glfw.hints.refreshRate, 0);
    }

    window->monitor    = wndconfig.monitor;
    window->resizable  = wndconfig.resizable;
    window->decorated  = wndconfig.decorated;
    window->cursorMode = GLFW_CURSOR_NORMAL;

    // Save the currently current context so it can be restored later
    previous = (_GLFWwindow*) glfwGetCurrentContext();

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    glfwMakeContextCurrent((GLFWwindow*) window);

    // Retrieve the actual (as opposed to requested) context attributes
    if (!_glfwRefreshContextAttribs())
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    // Verify the context against the requested parameters
    if (!_glfwIsValidContext(&wndconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        glfwMakeContextCurrent((GLFWwindow*) previous);
        return NULL;
    }

    // Clearing the front buffer to black to avoid garbage pixels left over
    // from previous uses of our bit of VRAM
    glClear(GL_COLOR_BUFFER_BIT);
    _glfwPlatformSwapBuffers(window);

    // Restore the previously current context (or NULL)
    glfwMakeContextCurrent((GLFWwindow*) previous);

    if (wndconfig.monitor == NULL && wndconfig.visible)
        glfwShowWindow((GLFWwindow*) window);

    return (GLFWwindow*) window;
}